

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.cpp
# Opt level: O0

int main(void)

{
  clock_t cVar1;
  clock_t cVar2;
  ostream *poVar3;
  int i_1;
  int i;
  clock_t end;
  clock_t start;
  thread threads [100];
  thread *in_stack_fffffffffffffc38;
  thread *in_stack_fffffffffffffc40;
  undefined1 *local_3b0;
  type *in_stack_fffffffffffffc68;
  thread *in_stack_fffffffffffffc70;
  undefined1 *local_368;
  int local_360;
  int local_33c;
  undefined1 local_328 [800];
  undefined1 auStack_8 [4];
  int local_4;
  
  local_4 = 0;
  local_368 = local_328;
  do {
    std::thread::thread((thread *)0x1022dd);
    local_368 = local_368 + 8;
  } while (local_368 != auStack_8);
  cVar1 = clock();
  cVar2 = clock();
  for (local_33c = 0; local_33c < 100; local_33c = local_33c + 1) {
    std::thread::thread<main::__0,,void>(in_stack_fffffffffffffc70,in_stack_fffffffffffffc68);
    std::thread::operator=(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    std::thread::~thread((thread *)0x10237a);
  }
  for (local_360 = 0; local_360 < 100; local_360 = local_360 + 1) {
    std::thread::join();
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Result = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,count);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout,"Time usage = ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,cVar2 - cVar1);
  std::operator<<(poVar3,"ms\n");
  getchar();
  local_4 = 0;
  local_3b0 = auStack_8;
  do {
    local_3b0 = local_3b0 + -8;
    std::thread::~thread((thread *)0x1024bc);
  } while (local_3b0 != local_328);
  return local_4;
}

Assistant:

int main() {
	std::thread threads[MAX_THREADS]; 
    clock_t start = clock();
    clock_t end = clock(); 

    for(int i = 0;i < MAX_THREADS; i++)
    {
	    threads[i] = std::thread([&](){
			    
			    while(count <= 1000000)
			    {

			    g_mutex.lock(); 
			    count ++; 
			    if (count > MAX_LOOPS)
			    {
			    end = clock(); 
			    }
			    g_mutex.unlock(); 
			    }
			    
			    }); 

    }

    for(int i = 0;i < MAX_THREADS; i++)
    {
	    threads[i].join(); 
    }
    
    std::cout << "Result = " << count << endl;
    std::cout << "Time usage = " << end - start << "ms\n";
//system("pause");
    getchar(); 
    return 0;
}